

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::eval_selection_bvec4(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  Vector<float,_4> local_6c;
  Vector<float,_4> local_5c;
  Vector<bool,_4> local_4c;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  Vector<bool,_4> local_28;
  Functional local_24 [4];
  undefined8 local_20;
  undefined8 local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  pfVar2 = tcu::Vector<float,_4>::z(c->in);
  fVar1 = *pfVar2;
  tcu::Vector<float,_4>::swizzle(&local_38,(int)local_10 + 0x40,3,2,1);
  tcu::Vector<float,_4>::Vector(&local_48,0.0,0.0,0.0,0.0);
  tcu::greaterThan<float,4>((tcu *)&local_28,&local_38,&local_48);
  tcu::Vector<float,_4>::swizzle(&local_5c,(int)local_10 + 0x50,0,3,2);
  tcu::Vector<float,_4>::Vector(&local_6c,0.0,0.0,0.0,0.0);
  tcu::greaterThan<float,4>((tcu *)&local_4c,&local_5c,&local_6c);
  selection<tcu::Vector<bool,4>>(local_24,0.0 < fVar1,&local_28,&local_4c);
  tcu::Vector<bool,_4>::asFloat((Vector<bool,_4> *)&local_20);
  *(undefined8 *)(local_10->color).m_data = local_20;
  *(undefined8 *)((local_10->color).m_data + 2) = local_18;
  return;
}

Assistant:

void eval_selection_bvec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(3, 2, 1, 0), Vec4(0.0f, 0.0f, 0.0f, 0.0f)),	greaterThan(c.in[2].swizzle(0, 3, 2, 1), Vec4(0.0f, 0.0f, 0.0f, 0.0f))).asFloat(); }